

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLUri::setScheme(XMLUri *this,XMLCh *newScheme)

{
  short *psVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  MalformedURLException *this_00;
  size_t __n;
  XMLCh *toLowerCase;
  
  if (newScheme == (XMLCh *)0x0) {
    this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x463,XMLNUM_URI_Component_Set_Null,(XMLCh *)errMsg_SCHEME,(XMLCh *)0x0,(XMLCh *)0x0
               ,(XMLCh *)0x0,this->fMemoryManager);
  }
  else {
    bVar2 = isConformantSchemeName(newScheme);
    if (bVar2) {
      if (this->fScheme != (XMLCh *)0x0) {
        (*this->fMemoryManager->_vptr_MemoryManager[4])();
      }
      __n = 0;
      do {
        psVar1 = (short *)((long)newScheme + __n);
        __n = __n + 2;
      } while (*psVar1 != 0);
      iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,__n);
      toLowerCase = (XMLCh *)CONCAT44(extraout_var,iVar3);
      memcpy(toLowerCase,newScheme,__n);
      this->fScheme = toLowerCase;
      XMLString::lowerCase(toLowerCase);
      return;
    }
    this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
    MalformedURLException::MalformedURLException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
               ,0x46c,XMLNUM_URI_Component_Not_Conformant,(XMLCh *)errMsg_SCHEME,newScheme,
               (XMLCh *)0x0,(XMLCh *)0x0,this->fMemoryManager);
  }
  __cxa_throw(this_00,&MalformedURLException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLUri::setScheme(const XMLCh* const newScheme)
{
    if ( !newScheme )
    {
        ThrowXMLwithMemMgr1(MalformedURLException
                , XMLExcepts::XMLNUM_URI_Component_Set_Null
                , errMsg_SCHEME
                , fMemoryManager);
    }

    if (!isConformantSchemeName(newScheme))
    {
        ThrowXMLwithMemMgr2(MalformedURLException
                , XMLExcepts::XMLNUM_URI_Component_Not_Conformant
                , errMsg_SCHEME
                , newScheme
                , fMemoryManager);
    }

    if (getScheme())
    {
        fMemoryManager->deallocate(fScheme);//delete [] fScheme;
    }

    fScheme = XMLString::replicate(newScheme, fMemoryManager);
    XMLString::lowerCase(fScheme);
}